

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxdn.cpp
# Opt level: O2

void __thiscall DSDcc::DSDNXDN::processVoiceFrameEFR(DSDNXDN *this,int symbolIndex,int dibit)

{
  DSDDecoder *pDVar1;
  double in_XMM0_Qa;
  double __x;
  
  if ((symbolIndex == 0) && ((this->m_dsdDecoder->m_opts).errorbars == 1)) {
    DSDLogger::log(&this->m_dsdDecoder->m_dsdLogger,in_XMM0_Qa);
  }
  storeSymbolDV(this,symbolIndex % 0x48,(uchar)dibit,false);
  if (symbolIndex % 0x48 == 0x47) {
    pDVar1 = this->m_dsdDecoder;
    pDVar1->m_mbeDVReady1 = true;
    if ((pDVar1->m_opts).errorbars == 1) {
      DSDLogger::log(&pDVar1->m_dsdLogger,__x);
      return;
    }
  }
  return;
}

Assistant:

void DSDNXDN::processVoiceFrameEFR(int symbolIndex, int dibit)
{
    if ((symbolIndex == 0) && (m_dsdDecoder->m_opts.errorbars == 1))
    {
        m_dsdDecoder->getLogger().log("\nMBE: ");
    }

    storeSymbolDV(symbolIndex % 72, dibit);

    if (symbolIndex % 72 == 71)
    {
        m_dsdDecoder->m_mbeDVReady1 = true; // Indicate that a DVSI frame is available

        if (m_dsdDecoder->m_opts.errorbars == 1)
        {
            m_dsdDecoder->getLogger().log(".");
        }
    }
}